

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

FeatureOptions<wasm::SIMDReplaceOp> * __thiscall
wasm::Random::FeatureOptions<wasm::SIMDReplaceOp>::
add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
          (FeatureOptions<wasm::SIMDReplaceOp> *this,FeatureSet feature,SIMDReplaceOp option,
          SIMDReplaceOp rest,SIMDReplaceOp rest_1,SIMDReplaceOp rest_2,SIMDReplaceOp rest_3)

{
  mapped_type *this_00;
  FeatureOptions<wasm::SIMDReplaceOp> *pFVar1;
  SIMDReplaceOp rest_local_2;
  SIMDReplaceOp rest_local_1;
  SIMDReplaceOp rest_local;
  SIMDReplaceOp option_local;
  FeatureOptions<wasm::SIMDReplaceOp> *this_local;
  FeatureSet feature_local;
  
  rest_local_1 = option;
  _rest_local = this;
  this_local._4_4_ = feature.features;
  this_00 = std::
            map<wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>_>_>_>
            ::operator[](&this->options,(key_type *)((long)&this_local + 4));
  std::vector<wasm::SIMDReplaceOp,_std::allocator<wasm::SIMDReplaceOp>_>::push_back
            (this_00,&rest_local_1);
  pFVar1 = add<wasm::SIMDReplaceOp,wasm::SIMDReplaceOp,wasm::SIMDReplaceOp>
                     (this,this_local._4_4_,rest,rest_1,rest_2,rest_3);
  return pFVar1;
}

Assistant:

FeatureOptions<T>& add(FeatureSet feature, T option, Ts... rest) {
      options[feature].push_back(option);
      return add(feature, rest...);
    }